

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetTimeCode(Cluster *this)

{
  long status;
  long len;
  longlong pos;
  Cluster *this_local;
  
  pos = (longlong)this;
  this_local = (Cluster *)Load(this,&len,&status);
  if (-1 < (long)this_local) {
    this_local = (Cluster *)this->m_timecode;
  }
  return (longlong)this_local;
}

Assistant:

long long Cluster::GetTimeCode() const {
  long long pos;
  long len;

  const long status = Load(pos, len);

  if (status < 0)  // error
    return status;

  return m_timecode;
}